

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O0

void __thiscall GPIO::HitachiLCDBase::int_out_nibble(HitachiLCDBase *this,bool data,uchar out)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RCX;
  size_t sVar3;
  void *in_RDX;
  void *__buf;
  byte in_SIL;
  long in_RDI;
  duration<long,_std::ratio<1L,_1000000L>_> *unaff_retaddr;
  uchar ctrl;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  byte local_2d;
  int local_2c;
  duration<long,std::ratio<1l,1000000l>> local_28 [12];
  int local_1c;
  duration<long,std::ratio<1l,1000000l>> local_18 [14];
  byte local_a;
  char local_9;
  
  local_a = (byte)in_RDX;
  sVar3 = CONCAT71((int7)((ulong)in_RCX >> 8),in_SIL) & 0xffffffffffffff01;
  local_9 = (char)sVar3;
  if ((*(byte *)(in_RDI + 0x2c) & 1) == 0) {
    GPIOBase::write((GPIOBase *)(in_RDI + 8),*(int *)(in_RDI + 0x10),(void *)((ulong)in_SIL & 1),
                    sVar3);
    GPIOBase::write((GPIOBase *)(in_RDI + 8),*(int *)(in_RDI + 0x18),
                    (void *)(ulong)((local_a & 1) != 0),sVar3);
    uVar2 = (int)(uint)local_a >> 1;
    local_a = (byte)uVar2;
    GPIOBase::write((GPIOBase *)(in_RDI + 8),*(int *)(in_RDI + 0x1c),
                    (void *)(ulong)((uVar2 & 1) != 0),(ulong)uVar2);
    uVar2 = (int)(uint)local_a >> 1;
    local_a = (byte)uVar2;
    GPIOBase::write((GPIOBase *)(in_RDI + 8),*(int *)(in_RDI + 0x20),
                    (void *)(ulong)((uVar2 & 1) != 0),(ulong)uVar2);
    uVar2 = (int)(uint)local_a >> 1;
    local_a = (byte)uVar2;
    GPIOBase::write((GPIOBase *)(in_RDI + 8),*(int *)(in_RDI + 0x24),
                    (void *)(ulong)((uVar2 & 1) != 0),(ulong)uVar2);
    GPIOBase::set((GPIOBase *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
    local_1c = 0x37;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_18,&local_1c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(unaff_retaddr);
    GPIOBase::clear((GPIOBase *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    local_2c = 0x37;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_28,&local_2c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(unaff_retaddr);
  }
  else {
    local_2d = local_a;
    if ((*(byte *)(in_RDI + 0x2e) & 1) != 0) {
      local_2d = local_a << 4;
    }
    if (local_9 != '\0') {
      local_2d = local_2d | (byte)*(undefined4 *)(in_RDI + 0x10);
    }
    if ((*(byte *)(in_RDI + 0x2f) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x2d) & 1) == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(uint *)(in_RDI + 0x28);
      }
      bVar1 = (byte)uVar2;
    }
    else {
      if ((*(byte *)(in_RDI + 0x2d) & 1) == 0) {
        uVar2 = *(uint *)(in_RDI + 0x28);
      }
      else {
        uVar2 = 0;
      }
      bVar1 = (byte)uVar2;
    }
    local_2d = local_2d | bVar1;
    sVar3 = (size_t)uVar2;
    I2C::write((I2C *)(in_RDI + 0xc),*(uint *)(in_RDI + 0x14) | (uint)local_2d,in_RDX,sVar3);
    I2C::write((I2C *)(in_RDI + 0xc),(uint)local_2d,__buf,sVar3);
  }
  return;
}

Assistant:

void HitachiLCDBase::int_out_nibble(bool data, unsigned char out) const
{
    if (!m_i2c) {

        // display directly attached to GPIO

        gpio.write(m_rs, data);
        gpio.write(m_d4, out & 1);
        out >>= 1;
        gpio.write(m_d5, out & 1);
        out >>= 1;
        gpio.write(m_d6, out & 1);
        out >>= 1;
        gpio.write(m_d7, out & 1);

        // send enable (strobe) to display

        gpio.set(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

        // clear enable (the display takes the data on the falling edge)

        gpio.clear(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

    } else {

        // display attached on I2C bus

        unsigned char ctrl = out;
        if (m_upper_expander) {
            ctrl <<= 4;
        }
        if (data) ctrl |= m_rs;
        if (m_inverted_backlight_toggle) {
            ctrl |= ((m_backlit) ? 0 : m_backlight);
        } else {
            ctrl |= ((m_backlit) ? m_backlight : 0);
        }

        // send enable (strobe)

        i2c.write(m_en | ctrl);

        // and clear strobe (the display takes the data on the falling edge)

        i2c.write(ctrl);

    }
}